

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_ocsp_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  bool bVar2;
  CBB contents;
  
  bVar2 = true;
  if ((hs->config->field_0x10d & 4) != 0) {
    iVar1 = CBB_add_u16(out_compressible,5);
    if (((iVar1 != 0) &&
        (iVar1 = CBB_add_u16_length_prefixed(out_compressible,&contents), iVar1 != 0)) &&
       (iVar1 = CBB_add_u8(&contents,'\x01'), iVar1 != 0)) {
      iVar1 = CBB_add_u16(&contents,0);
      if (iVar1 == 0) {
        return false;
      }
      iVar1 = CBB_add_u16(&contents,0);
      if (iVar1 == 0) {
        return false;
      }
      iVar1 = CBB_flush(out_compressible);
      return iVar1 != 0;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool ext_ocsp_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                     CBB *out_compressible,
                                     ssl_client_hello_type_t type) {
  if (!hs->config->ocsp_stapling_enabled) {
    return true;
  }

  CBB contents;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_status_request) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u8(&contents, TLSEXT_STATUSTYPE_ocsp) ||
      !CBB_add_u16(&contents, 0 /* empty responder ID list */) ||
      !CBB_add_u16(&contents, 0 /* empty request extensions */) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}